

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

SearchResult<unsigned_long,_false> __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
::
binary_search_impl<google::protobuf::Descriptor_const*,absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,google::protobuf::Descriptor_const*>::checked_compare>
          (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
           *this,Descriptor **k,unsigned_long s,unsigned_long e,checked_compare *comp)

{
  bool bVar1;
  template_ElementType<3UL> *ppDVar2;
  unsigned_long uVar3;
  
  while (uVar3 = e, s != uVar3) {
    e = uVar3 + s >> 1;
    ppDVar2 = GetField<3ul>(this);
    bVar1 = key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>
            ::checked_compare::
            operator()<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_0>
                      (comp,ppDVar2 + e,k);
    if (bVar1) {
      s = e + 1;
      e = uVar3;
    }
  }
  return (SearchResult<unsigned_long,_false>)uVar3;
}

Assistant:

SearchResult<size_type, false> binary_search_impl(
      const K &k, size_type s, size_type e, const Compare &comp,
      std::false_type /* IsCompareTo */) const {
    while (s != e) {
      const size_type mid = (s + e) >> 1;
      if (comp(key(mid), k)) {
        s = mid + 1;
      } else {
        e = mid;
      }
    }
    return SearchResult<size_type, false>{s};
  }